

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void auto_tile_size_balancing(AV1_COMMON *cm,int num_sbs,int num_tiles_lg,int tile_col_row)

{
  byte bVar1;
  int iVar2;
  int local_40;
  int inc_index;
  int num_tiles;
  int res_sbs;
  int size_sb;
  int start_sb;
  int i;
  CommonTileParams *tiles;
  int tile_col_row_local;
  int num_tiles_lg_local;
  int num_sbs_local;
  AV1_COMMON *cm_local;
  
  bVar1 = (byte)num_tiles_lg;
  size_sb = num_sbs >> (bVar1 & 0x1f);
  iVar2 = size_sb << (bVar1 & 0x1f);
  (cm->tiles).uniform_spacing = 0;
  i = 0;
  for (start_sb = 0; start_sb < num_sbs && i < 0x40; start_sb = local_40 + start_sb) {
    if (i == (1 << (bVar1 & 0x1f)) - (num_sbs - iVar2)) {
      size_sb = size_sb + 1;
    }
    if (tile_col_row == 0) {
      (cm->tiles).row_start_sb[i] = start_sb;
    }
    else {
      (cm->tiles).col_start_sb[i] = start_sb;
    }
    if (size_sb < (cm->tiles).max_width_sb) {
      local_40 = size_sb;
    }
    else {
      local_40 = (cm->tiles).max_width_sb;
    }
    i = i + 1;
  }
  if (tile_col_row == 0) {
    (cm->tiles).rows = i;
    (cm->tiles).row_start_sb[i] = num_sbs;
  }
  else {
    (cm->tiles).cols = i;
    (cm->tiles).col_start_sb[i] = num_sbs;
  }
  return;
}

Assistant:

static void auto_tile_size_balancing(AV1_COMMON *const cm, int num_sbs,
                                     int num_tiles_lg, int tile_col_row) {
  CommonTileParams *const tiles = &cm->tiles;
  int i, start_sb;
  int size_sb = num_sbs >> num_tiles_lg;
  int res_sbs = num_sbs - (size_sb << num_tiles_lg);
  int num_tiles = 1 << num_tiles_lg;
  int inc_index = num_tiles - res_sbs;

  tiles->uniform_spacing = 0;

  for (i = 0, start_sb = 0; start_sb < num_sbs && i < MAX_TILE_COLS; ++i) {
    if (i == inc_index) ++size_sb;
    if (tile_col_row)
      tiles->col_start_sb[i] = start_sb;
    else
      tiles->row_start_sb[i] = start_sb;

    start_sb += AOMMIN(size_sb, tiles->max_width_sb);
  }

  if (tile_col_row) {
    tiles->cols = i;
    tiles->col_start_sb[i] = num_sbs;
  } else {
    tiles->rows = i;
    tiles->row_start_sb[i] = num_sbs;
  }
}